

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::changeEvent(QAbstractSpinBox *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  KeyboardModifier KVar4;
  QAbstractSpinBoxPrivate *pQVar5;
  QStyle *pQVar6;
  QWidget *this_00;
  QEvent *in_RSI;
  QEvent *in_RDI;
  QWidget *in_stack_00000018;
  QAbstractSpinBoxPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffffd0;
  
  pQVar5 = d_func((QAbstractSpinBox *)0x687921);
  TVar2 = QEvent::type(in_RSI);
  this_00 = (QWidget *)(ulong)(TVar2 - LocaleChange);
  switch(this_00) {
  case (QWidget *)0x0:
    (**(code **)(*(long *)&pQVar5->super_QWidgetPrivate + 0xc0))();
    break;
  default:
    break;
  case (QWidget *)0xa:
    bVar1 = QWidget::isEnabled((QWidget *)0x687a8c);
    if (!bVar1) {
      QAbstractSpinBoxPrivate::reset(in_stack_ffffffffffffffd0);
    }
    break;
  case (QWidget *)0xb:
    bVar1 = QWidget::isActiveWindow(in_stack_00000018);
    if ((!bVar1) &&
       (QAbstractSpinBoxPrivate::reset(in_stack_ffffffffffffffd0),
       (*(ushort *)&pQVar5->field_0x3d0 & 1) != 0)) {
      (**(code **)(*(long *)&pQVar5->super_QWidgetPrivate + 0xd0))(pQVar5,0);
    }
    break;
  case (QWidget *)0xc:
    pQVar6 = QWidget::style(in_stack_ffffffffffffffc8);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x2c,0,in_RDI);
    pQVar5->spinClickTimerInterval = iVar3;
    pQVar6 = QWidget::style(in_stack_ffffffffffffffc8);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x53,0,in_RDI);
    pQVar5->spinClickThresholdTimerInterval = iVar3;
    if (pQVar5->edit != (QLineEdit *)0x0) {
      in_stack_ffffffffffffffd0 = (QAbstractSpinBoxPrivate *)pQVar5->edit;
      pQVar6 = QWidget::style(in_stack_ffffffffffffffc8);
      (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x73,0,in_RDI);
      QLineEdit::setFrame((QLineEdit *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
    }
    pQVar6 = QWidget::style(in_stack_ffffffffffffffc8);
    KVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x74,0,in_RDI);
    pQVar5->stepModifier = KVar4;
    QAbstractSpinBoxPrivate::reset(in_stack_ffffffffffffffd0);
    (**(code **)(*(long *)&pQVar5->super_QWidgetPrivate + 0x100))();
  }
  QWidget::changeEvent(this_00,in_RDI);
  return;
}

Assistant:

void QAbstractSpinBox::changeEvent(QEvent *event)
{
    Q_D(QAbstractSpinBox);

    switch (event->type()) {
        case QEvent::StyleChange:
            d->spinClickTimerInterval = style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatRate, nullptr, this);
            d->spinClickThresholdTimerInterval =
                style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatThreshold, nullptr, this);
            if (d->edit)
                d->edit->setFrame(!style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this));
            d->stepModifier = static_cast<Qt::KeyboardModifier>(style()->styleHint(QStyle::SH_SpinBox_StepModifier, nullptr, this));
            d->reset();
            d->updateEditFieldGeometry();
            break;
        case QEvent::LocaleChange:
            d->updateEdit();
            break;
        case QEvent::EnabledChange:
            if (!isEnabled()) {
                d->reset();
            }
            break;
        case QEvent::ActivationChange:
            if (!isActiveWindow()){
                d->reset();
                if (d->pendingEmit) // pendingEmit can be true even if it hasn't changed.
                    d->interpret(EmitIfChanged); // E.g. 10 to 10.0
            }
            break;
        default:
            break;
    }
    QWidget::changeEvent(event);
}